

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

bool __thiscall Moc::parseClassHead(Moc *this,ClassDef *def)

{
  bool bVar1;
  Token TVar2;
  Symbol *pSVar3;
  QByteArray *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  iterator iVar4;
  bool foundRBrace;
  Access access;
  Token token;
  int i;
  Type type;
  QByteArray lex_1;
  QByteArray lex;
  QByteArray name;
  rvalue_ref in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  Token in_stack_fffffffffffffe44;
  Moc *in_stack_fffffffffffffe48;
  char **in_stack_fffffffffffffe50;
  QByteArray *in_stack_fffffffffffffe58;
  undefined6 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe66;
  bool bVar5;
  undefined1 in_stack_fffffffffffffe67;
  undefined4 in_stack_fffffffffffffe70;
  Token in_stack_fffffffffffffe74;
  Moc *this_00;
  undefined1 in_stack_fffffffffffffe78 [16];
  undefined4 local_168;
  byte local_141;
  undefined1 local_140 [64];
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QByteArray local_58 [2];
  undefined4 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    TVar2 = Parser::lookup((Parser *)
                           CONCAT17(in_stack_fffffffffffffe67,
                                    CONCAT16(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60)),
                           (int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    if ((TVar2 == COLON) || (TVar2 == LBRACE)) break;
    if ((TVar2 == SEMIC) || (TVar2 == PP_RANGLE)) {
      local_141 = 0;
      goto LAB_0012f171;
    }
  } while (TVar2 != NOTOKEN);
  skipCxxAttributes(in_stack_fffffffffffffe48);
  bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
  if (!bVar1) {
    local_141 = 0;
    goto LAB_0012f171;
  }
  local_58[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_58[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  Parser::lexem(&in_stack_fffffffffffffe48->super_Parser);
  bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
  if (bVar1) {
    until(in_stack_fffffffffffffe78._0_8_,in_stack_fffffffffffffe74);
    bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
    if (bVar1) {
      Parser::lexem(&in_stack_fffffffffffffe48->super_Parser);
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 &in_stack_fffffffffffffe38->classname);
      QByteArray::~QByteArray((QByteArray *)0x12eb88);
      goto LAB_0012eca0;
    }
    local_141 = 0;
  }
  else {
    bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
    if (bVar1) {
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      Parser::lexem(&in_stack_fffffffffffffe48->super_Parser);
      local_90 = "final";
      bVar1 = ::operator!=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      bVar5 = false;
      if (bVar1) {
        local_98 = "sealed";
        bVar1 = ::operator!=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        bVar5 = false;
        if (bVar1) {
          local_a0 = "Q_DECL_FINAL";
          bVar5 = ::operator!=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        }
      }
      if (bVar5 != false) {
        QByteArray::operator=(local_58,(QByteArray *)&local_88);
      }
      QByteArray::~QByteArray((QByteArray *)0x12ec9e);
    }
LAB_0012eca0:
    QByteArray::operator+=
              ((QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               &in_stack_fffffffffffffe38->classname);
    while (bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44),
          bVar1) {
      Parser::lexem(&in_stack_fffffffffffffe48->super_Parser);
      QByteArray::operator+=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 &in_stack_fffffffffffffe38->classname);
      QByteArray::~QByteArray((QByteArray *)0x12ed03);
      bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
      if (bVar1) {
        Parser::lexem(&in_stack_fffffffffffffe48->super_Parser);
        QByteArray::operator=
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   &in_stack_fffffffffffffe38->classname);
        QByteArray::~QByteArray((QByteArray *)0x12ed4c);
        QByteArray::operator+=
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   &in_stack_fffffffffffffe38->classname);
      }
    }
    QByteArray::operator=(in_RSI,(QByteArray *)local_58);
    pSVar3 = Parser::symbol((Parser *)0x12ed83);
    in_RSI[5].d.ptr = (char *)(long)pSVar3->lineNum;
    bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
    if (bVar1) {
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      local_e0 = &DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      Parser::lexem(&in_stack_fffffffffffffe48->super_Parser);
      local_f0 = "final";
      bVar1 = ::operator!=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
      bVar5 = false;
      if (bVar1) {
        local_f8 = "sealed";
        bVar1 = ::operator!=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        bVar5 = false;
        if (bVar1) {
          local_100 = "Q_DECL_FINAL";
          bVar5 = ::operator!=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        }
      }
      if (bVar5 != false) {
        local_141 = 0;
      }
      QByteArray::~QByteArray((QByteArray *)0x12eea8);
      if (bVar5 != false) goto LAB_0012f164;
    }
    bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
    this_00 = in_stack_fffffffffffffe78._0_8_;
    if (bVar1) {
      do {
        Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
        local_168 = 2;
        bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
        if (bVar1) {
          local_168 = 0;
        }
        else {
          bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
          if (bVar1) {
            local_168 = 1;
          }
          else {
            Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
          }
        }
        Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
        memset(local_140,0xaa,0x40);
        parseType((Moc *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
        if (bVar1) {
          until(in_stack_fffffffffffffe78._0_8_,in_stack_fffffffffffffe74);
        }
        else {
          QByteArray::QByteArray
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     &in_stack_fffffffffffffe38->classname);
          toFullyQualified((Moc *)&stack0xffffffffffffffd8,(QByteArray *)in_stack_fffffffffffffe48);
          QByteArray::QByteArray
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     &in_stack_fffffffffffffe38->classname);
          local_10 = local_168;
          QList<SuperClass>::push_back
                    ((QList<SuperClass> *)
                     CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     in_stack_fffffffffffffe38);
          SuperClass::~SuperClass
                    ((SuperClass *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        }
        Type::~Type((Type *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
        this_00 = in_stack_fffffffffffffe78._0_8_;
      } while (bVar1);
      bVar1 = QList<SuperClass>::isEmpty((QList<SuperClass> *)0x12f04a);
      if (!bVar1) {
        in_stack_fffffffffffffe48 = (Moc *)(in_RDI + 0xe8);
        QList<SuperClass>::constFirst
                  ((QList<SuperClass> *)
                   CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        bVar1 = QHash<QByteArray,_QByteArray>::contains
                          ((QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffe48,
                           (QByteArray *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        if (bVar1) {
          QHash<QByteArray,_QByteArray>::insert
                    ((QHash<QByteArray,_QByteArray> *)
                     CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                     &in_stack_fffffffffffffe38->classname,(QByteArray *)0x12f0a5);
          iVar4 = QHash<QByteArray,_QByteArray>::insert
                            ((QHash<QByteArray,_QByteArray> *)
                             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                             &in_stack_fffffffffffffe38->classname,(QByteArray *)0x12f0d2);
          this_00 = (Moc *)iVar4.i.d;
        }
      }
    }
    bVar1 = Parser::test(&in_stack_fffffffffffffe48->super_Parser,in_stack_fffffffffffffe44);
    if (bVar1) {
      in_RSI[4].d.size = *(long *)(in_RDI + 0x18) + -1;
      local_141 = until(this_00,in_stack_fffffffffffffe74);
      in_RSI[5].d.d = *(Data **)(in_RDI + 0x18);
      *(qsizetype *)(in_RDI + 0x18) = in_RSI[4].d.size + 1;
    }
    else {
      local_141 = 0;
    }
  }
LAB_0012f164:
  QByteArray::~QByteArray((QByteArray *)0x12f171);
LAB_0012f171:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_141 & 1);
}

Assistant:

bool Moc::parseClassHead(ClassDef *def)
{
    // figure out whether this is a class declaration, or only a
    // forward or variable declaration.
    int i = 0;
    Token token;
    do {
        token = lookup(i++);
        if (token == COLON || token == LBRACE)
            break;
        if (token == SEMIC || token == RANGLE)
            return false;
    } while (token);

    // support attributes like "class [[deprecated]]] name"
    skipCxxAttributes();

    if (!test(IDENTIFIER)) // typedef struct { ... }
        return false;
    QByteArray name = lexem();

    // support "class IDENT name" and "class IDENT(IDENT) name"
    // also support "class IDENT name (final|sealed|Q_DECL_FINAL)"
    if (test(LPAREN)) {
        until(RPAREN);
        if (!test(IDENTIFIER))
            return false;
        name = lexem();
    } else  if (test(IDENTIFIER)) {
        const QByteArray lex = lexem();
        if (lex != "final" && lex != "sealed" && lex != "Q_DECL_FINAL")
            name = lex;
    }

    def->qualified += name;
    while (test(SCOPE)) {
        def->qualified += lexem();
        if (test(IDENTIFIER)) {
            name = lexem();
            def->qualified += name;
        }
    }
    def->classname = name;
    def->lineNumber = symbol().lineNum;

    if (test(IDENTIFIER)) {
        const QByteArray lex = lexem();
        if (lex != "final" && lex != "sealed" && lex != "Q_DECL_FINAL")
            return false;
    }

    if (test(COLON)) {
        do {
            test(VIRTUAL);
            FunctionDef::Access access = FunctionDef::Public;
            if (test(PRIVATE))
                access = FunctionDef::Private;
            else if (test(PROTECTED))
                access = FunctionDef::Protected;
            else
                test(PUBLIC);
            test(VIRTUAL);
            const Type type = parseType();
            // ignore the 'class Foo : BAR(Baz)' case
            if (test(LPAREN)) {
                until(RPAREN);
            } else {
                def->superclassList.push_back({type.name, toFullyQualified(type.name), access});
            }
        } while (test(COMMA));

        if (!def->superclassList.isEmpty()
            && knownGadgets.contains(def->superclassList.constFirst().classname)) {
            // Q_GADGET subclasses are treated as Q_GADGETs
            knownGadgets.insert(def->classname, def->qualified);
            knownGadgets.insert(def->qualified, def->qualified);
        }
    }
    if (!test(LBRACE))
        return false;
    def->begin = index - 1;
    bool foundRBrace = until(RBRACE);
    def->end = index;
    index = def->begin + 1;
    return foundRBrace;
}